

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparams.cpp
# Opt level: O0

void SelectParams(ChainType chain)

{
  undefined4 in_EDI;
  long in_FS_OFFSET;
  ChainType unaff_retaddr;
  ChainType in_stack_0000002c;
  ArgsManager *in_stack_00000030;
  unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *puVar1;
  undefined4 in_stack_ffffffffffffffe8;
  unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  SelectBaseParams(unaff_retaddr);
  puVar1 = &local_10;
  CreateChainParams(in_stack_00000030,in_stack_0000002c);
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::operator=
            ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)
             CONCAT44(in_EDI,in_stack_ffffffffffffffe8),puVar1);
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)
             CONCAT44(in_EDI,in_stack_ffffffffffffffe8));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SelectParams(const ChainType chain)
{
    SelectBaseParams(chain);
    globalChainParams = CreateChainParams(gArgs, chain);
}